

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_mathWithNonStandardCellMLPrefix_Test::~Parser_mathWithNonStandardCellMLPrefix_Test
          (Parser_mathWithNonStandardCellMLPrefix_Test *this)

{
  Parser_mathWithNonStandardCellMLPrefix_Test *this_local;
  
  ~Parser_mathWithNonStandardCellMLPrefix_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, mathWithNonStandardCellMLPrefix)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" xmlns:ns_1=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <component name=\"\">\n"
        "    <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "      <apply>\n"
        "        <eq/>\n"
        "        <ci>b2</ci>\n"
        "        <apply>\n"
        "          <times/>\n"
        "          <cn ns_1:units=\"dimensionless\">2.0</cn>\n"
        "          <ci>d</ci>\n"
        "        </apply>\n"
        "      </apply>\n"
        "    </math>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    parser->parseModel(in);

    EXPECT_EQ(size_t(0), parser->issueCount());
}